

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float64 float128_to_float64_m68k(float128 a,float_status *status)

{
  uint64_t zSig;
  uint uVar1;
  int zExp;
  float64 fVar2;
  ulong uVar3;
  uint64_t aSig1;
  ulong uVar4;
  
  uVar3 = a.high;
  uVar4 = a.low;
  uVar1 = a.high._6_2_ & 0x7fff;
  if (uVar1 == 0x7fff) {
    if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
        uVar4 == 0) {
      uVar3 = uVar3 & 0x8000000000000000 | 0x7ff0000000000000;
    }
    else {
      if (((uVar3 & 0x7fff800000000000) == 0x7fff000000000000) &&
         (((undefined1  [16])a & (undefined1  [16])0x7fffffffffff) != (undefined1  [16])0x0 ||
          uVar4 != 0)) {
        status->float_exception_flags = status->float_exception_flags | 1;
      }
      uVar4 = uVar4 >> 0x30 | uVar3 << 0x10;
      uVar3 = uVar3 & 0x8000000000000000 | 0x7ff0000000000000 | uVar4 >> 0xc;
      if (uVar4 < 0x1000) {
        uVar3 = 0x7fffffffffffffff;
      }
      if (status->default_nan_mode != '\0') {
        uVar3 = 0x7fffffffffffffff;
      }
    }
    return uVar3;
  }
  uVar3 = (ulong)(((undefined1  [16])a & (undefined1  [16])0x3ffffffffffff) != (undefined1  [16])0x0
                 ) | (uVar3 & 0xffffffffffff) << 0xe | uVar4 >> 0x32;
  zExp = uVar1 - 0x3c01;
  zSig = uVar3 | 0x4000000000000000;
  if (uVar3 == 0 &&
      ((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
    zExp = 0;
    zSig = 0;
  }
  fVar2 = roundAndPackFloat64(a.high._7_1_ >> 7,zExp,zSig,status);
  return fVar2;
}

Assistant:

float64 float128_to_float64(float128 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig0, aSig1;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    if ( aExp == 0x7FFF ) {
        if ( aSig0 | aSig1 ) {
            return commonNaNToFloat64(float128ToCommonNaN(a, status), status);
        }
        return packFloat64( aSign, 0x7FF, 0 );
    }
    shortShift128Left( aSig0, aSig1, 14, &aSig0, &aSig1 );
    aSig0 |= ( aSig1 != 0 );
    if ( aExp || aSig0 ) {
        aSig0 |= UINT64_C(0x4000000000000000);
        aExp -= 0x3C01;
    }
    return roundAndPackFloat64(aSign, aExp, aSig0, status);

}